

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_archive_truncate(mz_zip_archive *pzip)

{
  mz_zip_internal_state *pmVar1;
  mz_uint64 mVar2;
  int iVar3;
  
  pmVar1 = pzip->m_pState;
  mVar2 = pzip->m_archive_size;
  if ((((pzip->m_pWrite != mz_zip_heap_write_func) || (pmVar1->m_pMem == (void *)0x0)) &&
      (pzip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED)) &&
     ((FILE *)pmVar1->m_pFile != (FILE *)0x0)) {
    iVar3 = fileno((FILE *)pmVar1->m_pFile);
    iVar3 = ftruncate(iVar3,mVar2 + pmVar1->m_file_archive_start_ofs);
    return iVar3;
  }
  return 0x10ac11;
}

Assistant:

static int zip_archive_truncate(mz_zip_archive *pzip) {
  mz_zip_internal_state *pState = pzip->m_pState;
  mz_uint64 file_size = pzip->m_archive_size;
  if ((pzip->m_pWrite == mz_zip_heap_write_func) && (pState->m_pMem)) {
    return 0;
  }
  if (pzip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED) {
    if (pState->m_pFile) {
      int fd = fileno(pState->m_pFile);
      return ftruncate(fd, pState->m_file_archive_start_ofs + file_size);
    }
  }
  return 0;
}